

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sineWaveTemporalCoding.cpp
# Opt level: O1

int main(void)

{
  time_t tVar1;
  ANN *this;
  Dense *pDVar2;
  Parameters *param;
  Population *this_00;
  ArtificialPopulation *this_01;
  Population *this_02;
  ostream *poVar3;
  TemporalPhaseEncodingSynapse_param *param_00;
  TemporalPhaseEncodingSynapse *this_03;
  TemporalPhaseDecodingSynapse_param *param_01;
  TemporalPhaseDecodingSynapse *this_04;
  Network_param *param_02;
  MatrixXd w;
  MatrixXd b;
  Network n;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  string local_100;
  string local_e0;
  string local_c0;
  DenseStorage<double,__1,__1,__1,_0> local_a0;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  Network local_70;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this = (ANN *)operator_new(0x40);
  ANN::ANN(this);
  ANN::setInputSize(this,1);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"tanh","");
  ANN::addLayer(this,1,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,1,1,1);
  if ((0 < local_138.m_rows) && (0 < local_138.m_cols)) {
    *local_138.m_data = 0.1;
    local_118.m_data = (double *)0x0;
    local_118.m_rows = 0;
    local_118.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,1,1,1);
    if ((0 < local_118.m_rows) && (0 < local_118.m_cols)) {
      *local_118.m_data = 0.0;
      pDVar2 = (Dense *)ANN::getLayer(this,0);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_88,&local_138);
      Dense::setWeights(pDVar2,(MatrixXd *)&local_88);
      free(local_88.m_data);
      pDVar2 = (Dense *)ANN::getLayer(this,0);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_a0,&local_118);
      Dense::setBiases(pDVar2,(MatrixXd *)&local_a0);
      free(local_a0.m_data);
      param = (Parameters *)operator_new(0x58);
      *(undefined8 *)(param + 0x10) = 0;
      *(undefined8 *)(param + 0x18) = 0;
      *(undefined8 *)param = 0;
      *(undefined8 *)(param + 8) = 0;
      *(undefined8 *)(param + 0x20) = 0;
      *(undefined8 *)(param + 0x28) = 0;
      *(undefined8 *)(param + 0x30) = 0;
      *(undefined8 *)(param + 0x38) = 0;
      *(undefined8 *)(param + 0x40) = 0;
      *(undefined8 *)(param + 0x48) = 0;
      *(undefined8 *)(param + 0x50) = 0;
      *(undefined8 *)(param + 8) = 0;
      *(undefined8 *)(param + 0x10) = 0;
      *(undefined8 *)(param + 0x18) = 0;
      *(undefined8 *)(param + 0x20) = 0;
      *(undefined8 *)(param + 0x28) = 0;
      *(undefined8 *)(param + 0x30) = 0;
      *(undefined8 *)(param + 0x38) = 0x3ff0000000000000;
      *(undefined8 *)param = 0x3fb999999999999a;
      this_00 = (Population *)operator_new(0x60);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"SignalGenerator","");
      Population::Population(this_00,1,&local_e0,param);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      this_01 = (ArtificialPopulation *)operator_new(0x98);
      ArtificialPopulation::ArtificialPopulation(this_01,this);
      this_02 = (Population *)operator_new(0x60);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"PassThrough","");
      Population::Population(this_02,1,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      param_00 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
      *(undefined8 *)param_00 = 0;
      param_00->som_phase = 0.0;
      param_00->window_length_s = 0.0;
      *(undefined4 *)&param_00->som_phase = 0;
      *(undefined4 *)((long)&param_00->som_phase + 4) = 0;
      *(undefined4 *)&param_00->window_length_s = 0x9999999a;
      *(undefined4 *)((long)&param_00->window_length_s + 4) = 0x3fb99999;
      param_00->som_frequency = 800;
      this_03 = (TemporalPhaseEncodingSynapse *)operator_new(0x78);
      TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse(this_03,this_00,this_02,param_00);
      param_01 = (TemporalPhaseDecodingSynapse_param *)operator_new(0x20);
      param_01->window_length_s = 0.0;
      param_01->delay_s = 0.0;
      *(undefined8 *)param_01 = 0;
      param_01->som_phase = 0.0;
      *(undefined4 *)&param_01->som_phase = 0;
      *(undefined4 *)((long)&param_01->som_phase + 4) = 0;
      *(undefined4 *)&param_01->window_length_s = 0;
      *(undefined4 *)((long)&param_01->window_length_s + 4) = 0x3fe00000;
      param_01->window_length_s = 0.1;
      param_01->delay_s = 0.0;
      param_01->som_frequency = 800;
      this_04 = (TemporalPhaseDecodingSynapse *)operator_new(0x78);
      TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse
                (this_04,this_02,(Population *)this_01,param_01);
      param_02 = (Network_param *)operator_new(8);
      param_02->dt = 0.001;
      Network::Network(&local_70,param_02);
      Network::add(&local_70,(Synapse *)this_03);
      Network::add(&local_70,(Synapse *)this_04);
      Network::run(&local_70,50.0);
      Network::~Network(&local_70);
      free(local_118.m_data);
      free(local_138.m_data);
      return 0;
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x16d,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
               );
}

Assistant:

int main() 
{
    srand(time(NULL));

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, "tanh");

    Eigen::MatrixXd w = Eigen::MatrixXd(1, 1);
    w(0,0) = 0.1;
    Eigen::MatrixXd b = Eigen::MatrixXd(1, 1);
    b(0,0) = 0.0;
    static_cast<Dense*>(ann->getLayer(0))->setWeights(w);
    static_cast<Dense*>(ann->getLayer(0))->setBiases(b);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = 0.1;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "PassThrough");
    cout << (long)p3 << endl;

    // Synapses
    TemporalPhaseEncodingSynapse_param* params1 = new TemporalPhaseEncodingSynapse_param();
    params1->window_length_s = 0.1;
    params1->som_frequency = 800;
    // params1->som_phase = M_PI / 2.0;
    TemporalPhaseEncodingSynapse* s1 = new TemporalPhaseEncodingSynapse(p1, p3, params1);

    TemporalPhaseDecodingSynapse_param* params2 = new TemporalPhaseDecodingSynapse_param();
    params2->window_length_s = 0.1;
    params2->som_frequency = 800;
    // params2->som_phase = M_PI / 2.0;
    TemporalPhaseDecodingSynapse* s2 = new TemporalPhaseDecodingSynapse(p3, p2, params2);

    // Create the network

    Network_param* n_param = new Network_param();
    n_param->dt = 0.001;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    // Run the network for 100 second
    n.run(50.0);
    
    return 0;
}